

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O2

int __thiscall
CDesign::GetWireInDirection
          (CDesign *this,vector<CNet_*,_std::allocator<CNet_*>_> *pNetList,
          vector<CWire_*,_std::allocator<CWire_*>_> *pWireList,int iPos,int iDirection,int iMode,
          int iValue)

{
  CNet *this_00;
  int iVar1;
  reference ppCVar2;
  ulong uVar3;
  ulong uVar4;
  size_type sVar5;
  
  if (2 < iValue - 1U) {
    if (iValue == 0x1000002) {
      uVar3 = (ulong)((long)(pNetList->super__Vector_base<CNet_*,_std::allocator<CNet_*>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(pNetList->super__Vector_base<CNet_*,_std::allocator<CNet_*>_>)._M_impl.
                           super__Vector_impl_data._M_start) >> 3;
      sVar5 = 0;
      uVar4 = uVar3 & 0xffffffff;
      if ((int)uVar3 < 1) {
        uVar4 = sVar5;
      }
      for (; uVar4 != sVar5; sVar5 = sVar5 + 1) {
        ppCVar2 = std::vector<CNet_*,_std::allocator<CNet_*>_>::at(pNetList,sVar5);
        this_00 = *ppCVar2;
        iVar1 = CNet::IsFlat(this_00);
        if ((iVar1 != 0) && (((this_00->super_CObject).m_iProp & 2) != 0)) {
          CNet::GetWireInDirection(this_00,pWireList,iPos,iDirection,0,0x30f);
        }
      }
      goto LAB_00108a16;
    }
    if (iValue != 0x30f) goto LAB_00108a16;
  }
  uVar3 = (ulong)((long)(pNetList->super__Vector_base<CNet_*,_std::allocator<CNet_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(pNetList->super__Vector_base<CNet_*,_std::allocator<CNet_*>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  sVar5 = 0;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = sVar5;
  }
  for (; uVar4 != sVar5; sVar5 = sVar5 + 1) {
    ppCVar2 = std::vector<CNet_*,_std::allocator<CNet_*>_>::at(pNetList,sVar5);
    CNet::GetWireInDirection(*ppCVar2,pWireList,iPos,iDirection,iMode,iValue);
  }
LAB_00108a16:
  return (int)((ulong)((long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int CDesign::GetWireInDirection(vector<CNet*>* pNetList, vector<CWire*>* pWireList, int iPos, int iDirection, int iMode, int iValue)
{
	switch(iValue){
		case STATE_WIRE_ANY:
		case STATE_WIRE_ROUTED:
		case STATE_WIRE_UNROUTED:
		case PROP_WIRE_ANY:
			for(int i=0,s=pNetList->size();i<s;i++)
			{
				CNet*	pNet	=	pNetList->at(i);
				pNet->GetWireInDirection(pWireList,iPos,iDirection,iMode,iValue);
			}
			break;
		case PROP_NET_FLAT|PROP_NET_TWOPIN:
			for(int i=0,s=pNetList->size();i<s;i++)
			{
				CNet*	pNet	=	pNetList->at(i);
				if(pNet->IsFlat()&&pNet->GetProp()&PROP_NET_TWOPIN)
					pNet->GetWireInDirection(pWireList,iPos,iDirection);
			}
			break;
	}


	return	pWireList->size();
}